

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseOutgoing.cpp
# Opt level: O3

void __thiscall tonk::SessionOutgoing::tonk_status(SessionOutgoing *this,TonkStatus *statusOut)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint bytes;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->OutgoingQueueLock);
  if (iVar1 == 0) {
    uVar3 = this->Queues[3].QueuedBytes;
    bytes = this->Queues[1].QueuedBytes + this->Queues[0].QueuedBytes + this->Queues[2].QueuedBytes;
    pthread_mutex_unlock((pthread_mutex_t *)&this->OutgoingQueueLock);
    uVar2 = SenderBandwidthControl::CalculateSendTimeMsec((this->Deps).SenderControl,bytes);
    statusOut->ReliableQueueMsec = uVar2;
    uVar3 = SenderBandwidthControl::CalculateSendTimeMsec((this->Deps).SenderControl,uVar3 + bytes);
    statusOut->LowPriQueueMsec = uVar3;
    statusOut->AppBPS = (((this->Deps).SenderControl)->Shape).AppBPS;
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void SessionOutgoing::tonk_status(TonkStatus& statusOut) const
{
    // WARNING: This function is not called on the Connection green thread,
    // so accessing members here is not threadsafe by default.

    unsigned unreliableQueueDepthBytes, reliableQueueDepthBytes, lowpriQueueDepthBytes;

    {
        Locker locker(OutgoingQueueLock);

        unreliableQueueDepthBytes = Queues[Queue_Unreliable].GetQueuedBytes();
        reliableQueueDepthBytes = Queues[Queue_Unmetered].GetQueuedBytes()
            + Queues[Queue_Reliable].GetQueuedBytes();
        lowpriQueueDepthBytes = Queues[Queue_LowPri].GetQueuedBytes();
    }

    // Reliable queue is behind unreliable queue
    reliableQueueDepthBytes += unreliableQueueDepthBytes;

    // Calculate reliable queue depth in milliseconds
    statusOut.ReliableQueueMsec = Deps.SenderControl->CalculateSendTimeMsec(
        reliableQueueDepthBytes);

    // Lowpri queue is behind reliable and unreliable queues
    lowpriQueueDepthBytes += reliableQueueDepthBytes;

    // Calculate lowpri queue depth in milliseconds
    statusOut.LowPriQueueMsec = Deps.SenderControl->CalculateSendTimeMsec(
        lowpriQueueDepthBytes);

    // Read BPS from bandwidth control
    statusOut.AppBPS = Deps.SenderControl->GetAppBPS();
}